

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnImportTable
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  Enum EVar1;
  char *pcVar2;
  char local_b8 [8];
  char buf [100];
  
  anon_unknown_21::SPrintLimits(local_b8,(size_t)elem_limits,(Limits *)module_name.data_);
  WriteIndent(this);
  if (elem_type < Anyfunc) {
    if (elem_type == Void) {
      pcVar2 = "void";
      goto LAB_00f3aafd;
    }
    if (elem_type == Func) {
      pcVar2 = "func";
      goto LAB_00f3aafd;
    }
    if (elem_type == ExceptRef) {
      pcVar2 = "except_ref";
      goto LAB_00f3aafd;
    }
switchD_00f3aa88_caseD_fffffff1:
    pcVar2 = "<type index>";
  }
  else {
    switch(elem_type) {
    case Any:
      pcVar2 = "any";
      break;
    case Anyfunc:
      pcVar2 = "anyfunc";
      break;
    default:
      goto switchD_00f3aa88_caseD_fffffff1;
    case V128:
      pcVar2 = "v128";
      break;
    case F64:
      pcVar2 = "f64";
      break;
    case F32:
      pcVar2 = "f32";
      break;
    case I64:
      pcVar2 = "i64";
      break;
    case I32:
      pcVar2 = "i32";
    }
  }
LAB_00f3aafd:
  Stream::Writef(this->stream_,
                 "OnImportTable(import_index: %u, table_index: %u, elem_type: %s, %s)\n",
                 (ulong)import_index,(ulong)table_index,pcVar2,local_b8);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x11])
                    (this->reader_,(ulong)import_index,(Limits *)module_name.data_,module_name.size_
                     ,field_name.data_,field_name.size_,(ulong)table_index,(ulong)(uint)elem_type,
                     elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportTable(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnImportTable(import_index: %" PRIindex ", table_index: %" PRIindex
       ", elem_type: %s, %s)\n",
       import_index, table_index, GetTypeName(elem_type), buf);
  return reader_->OnImportTable(import_index, module_name, field_name,
                                table_index, elem_type, elem_limits);
}